

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phase.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ifstream *piVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  undefined7 uVar10;
  undefined8 uVar8;
  ostream *poVar9;
  byte bVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  initializer_list<double> __l;
  allocator local_77d;
  int fft_length;
  ostringstream *local_778;
  int num_denominator_order;
  int num_numerator_order;
  ifstream *local_768;
  ulong local_760;
  ostringstream *local_758;
  vector<double,_std::allocator<double>_> waveform;
  char *local_730;
  vector<double,_std::allocator<double>_> numerator_coefficients;
  vector<double,_std::allocator<double>_> denominator_coefficients;
  vector<double,_std::allocator<double>_> output;
  FilterCoefficientsToPhaseSpectrum filter_coefficients_to_phase_spectrum;
  ifstream ifs_for_denominator;
  byte abStack_638 [488];
  ostringstream error_message_7;
  undefined1 local_440 [360];
  ostringstream error_message;
  byte abStack_2b8 [488];
  Buffer buffer;
  
  num_numerator_order = 0;
  num_denominator_order = 0;
  fft_length = 0x100;
  local_758 = (ostringstream *)0x0;
  local_778 = (ostringstream *)0x0;
  local_760 = 0;
  local_768 = (ifstream *)0x0;
  local_730 = (char *)0x0;
  while( true ) {
    iVar7 = ya_getopt_long(argc,argv,"l:m:n:z:p:uh",(option *)0x0,(int *)0x0);
    if (0xe < iVar7 - 0x6cU) break;
    uVar10 = (undefined7)((ulong)ya_optarg >> 8);
    switch(iVar7) {
    case 0x6c:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar4 = sptk::ConvertStringToInteger((string *)&error_message,&fft_length);
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -l option must be an integer");
        std::__cxx11::string::string
                  ((string *)&ifs_for_denominator,"phase",(allocator *)&error_message_7);
        sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
        goto LAB_001039a9;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar4 = sptk::ConvertStringToInteger((string *)&error_message,&num_numerator_order);
      bVar6 = num_numerator_order < 0;
      uVar8 = std::__cxx11::string::~string((string *)&error_message);
      local_760 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
      if (bVar6 || !bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -m option must be a non-negative integer");
        std::__cxx11::string::string
                  ((string *)&ifs_for_denominator,"phase",(allocator *)&error_message_7);
        sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
        goto LAB_001039a9;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string
                ((string *)&error_message,ya_optarg,(allocator *)&ifs_for_denominator);
      bVar4 = sptk::ConvertStringToInteger((string *)&error_message,&num_denominator_order);
      bVar6 = num_denominator_order < 0;
      uVar8 = std::__cxx11::string::~string((string *)&error_message);
      local_778 = (ostringstream *)CONCAT71((int7)((ulong)uVar8 >> 8),1);
      if (bVar6 || !bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -n option must be a non-negative integer");
        std::__cxx11::string::string
                  ((string *)&ifs_for_denominator,"phase",(allocator *)&error_message_7);
        sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
LAB_001039a9:
        std::__cxx11::string::~string((string *)&ifs_for_denominator);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        return 1;
      }
      break;
    default:
      goto switchD_00103675_caseD_6f;
    case 0x70:
      local_768 = (ifstream *)ya_optarg;
      local_778 = (ostringstream *)CONCAT71(uVar10,1);
      break;
    case 0x75:
      local_758 = (ostringstream *)
                  CONCAT71((int7)((ulong)((long)&switchD_00103675::switchdataD_0010c004 +
                                         (long)(int)(&switchD_00103675::switchdataD_0010c004)
                                                    [iVar7 - 0x6cU]) >> 8),1);
      break;
    case 0x7a:
      local_730 = ya_optarg;
      local_760 = CONCAT71(uVar10,1);
    }
  }
  if (iVar7 != -1) {
    if (iVar7 != 0x68) {
switchD_00103675_caseD_6f:
      anon_unknown.dwarf_2e0b::PrintUsage((ostream *)&std::cerr);
      return 1;
    }
    anon_unknown.dwarf_2e0b::PrintUsage((ostream *)&std::cout);
    goto LAB_001037fe;
  }
  bVar4 = sptk::SetBinaryMode();
  uVar2 = local_760;
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Cannot set translation mode");
    std::__cxx11::string::string
              ((string *)&ifs_for_denominator,"phase",(allocator *)&error_message_7);
    sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
    goto LAB_001039a9;
  }
  bVar3 = (byte)local_758;
  bVar11 = (byte)local_760;
  if (((local_760 & 1) == 0) && (((ulong)local_778 & 1) == 0)) {
    if (1 < argc - ya_optind) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,"Too many input files");
      std::__cxx11::string::string
                ((string *)&ifs_for_denominator,"phase",(allocator *)&error_message_7);
      sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
      goto LAB_001039a9;
    }
    if (argc == ya_optind) {
      pcVar12 = (char *)0x0;
    }
    else {
      pcVar12 = argv[ya_optind];
    }
    local_778 = &error_message;
    std::ifstream::ifstream(local_778);
    if ((pcVar12 == (char *)0x0) ||
       (std::ifstream::open((char *)&error_message,(_Ios_Openmode)pcVar12),
       (abStack_2b8[*(long *)(_error_message + -0x18)] & 5) == 0)) {
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 == '\0') {
        local_778 = (ostringstream *)&std::cin;
      }
      sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
                ((FilterCoefficientsToPhaseSpectrum *)&buffer,fft_length + -1,0,fft_length,
                 (bool)(bVar3 & 1));
      _error_message_7 = &PTR__Buffer_00111c10;
      memset(local_440,0,0x90);
      if ((char)buffer.imag_part1_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
        std::operator<<((ostream *)&ifs_for_denominator,
                        "Failed to initialize FilterCoefficientsToPhaseSpectrum");
        std::__cxx11::string::string
                  ((string *)&filter_coefficients_to_phase_spectrum,"phase",(allocator *)&waveform);
        sptk::PrintErrorMessage
                  ((string *)&filter_coefficients_to_phase_spectrum,
                   (ostringstream *)&ifs_for_denominator);
        std::__cxx11::string::~string((string *)&filter_coefficients_to_phase_spectrum);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator);
        iVar7 = 1;
        bVar4 = false;
      }
      else {
        iVar7 = fft_length / 2;
        std::vector<double,_std::allocator<double>_>::vector
                  (&waveform,(long)fft_length,(allocator_type *)&ifs_for_denominator);
        iVar7 = iVar7 + 1;
        local_760 = CONCAT44(local_760._4_4_,iVar7);
        std::vector<double,_std::allocator<double>_>::vector
                  (&numerator_coefficients,(long)iVar7,(allocator_type *)&ifs_for_denominator);
        iVar7 = 1;
        do {
          bVar4 = sptk::ReadStream<double>
                            (true,0,0,fft_length,&waveform,(istream *)local_778,(int *)0x0);
          if (!bVar4) {
            iVar7 = 0;
            goto LAB_0010434e;
          }
          filter_coefficients_to_phase_spectrum._vptr_FilterCoefficientsToPhaseSpectrum =
               (_func_int **)0x3ff0000000000000;
          __l._M_len = 1;
          __l._M_array = (iterator)&filter_coefficients_to_phase_spectrum;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&ifs_for_denominator,__l,
                     (allocator_type *)&denominator_coefficients);
          bVar6 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                            ((FilterCoefficientsToPhaseSpectrum *)&buffer,&waveform,
                             (vector<double,_std::allocator<double>_> *)&ifs_for_denominator,
                             &numerator_coefficients,(Buffer *)&error_message_7);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&ifs_for_denominator);
          if (!bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
            std::operator<<((ostream *)&ifs_for_denominator,"Failed to transform waveform to phase")
            ;
            std::__cxx11::string::string
                      ((string *)&filter_coefficients_to_phase_spectrum,"phase",
                       (allocator *)&denominator_coefficients);
            sptk::PrintErrorMessage
                      ((string *)&filter_coefficients_to_phase_spectrum,
                       (ostringstream *)&ifs_for_denominator);
            goto LAB_00104334;
          }
          bVar6 = sptk::WriteStream<double>
                            (0,(int)local_760,&numerator_coefficients,(ostream *)&std::cout,
                             (int *)0x0);
        } while (bVar6);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
        std::operator<<((ostream *)&ifs_for_denominator,"Failed to write phase");
        std::__cxx11::string::string
                  ((string *)&filter_coefficients_to_phase_spectrum,"phase",
                   (allocator *)&denominator_coefficients);
        sptk::PrintErrorMessage
                  ((string *)&filter_coefficients_to_phase_spectrum,
                   (ostringstream *)&ifs_for_denominator);
LAB_00104334:
        std::__cxx11::string::~string((string *)&filter_coefficients_to_phase_spectrum);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator);
LAB_0010434e:
        bVar4 = !bVar4;
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&numerator_coefficients.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&waveform.super__Vector_base<double,_std::allocator<double>_>);
      }
      sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer((Buffer *)&error_message_7);
      sptk::FilterCoefficientsToPhaseSpectrum::~FilterCoefficientsToPhaseSpectrum
                ((FilterCoefficientsToPhaseSpectrum *)&buffer);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
      poVar9 = std::operator<<((ostream *)&ifs_for_denominator,"Cannot open file ");
      std::operator<<(poVar9,pcVar12);
      std::__cxx11::string::string((string *)&error_message_7,"phase",(allocator *)&buffer);
      sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs_for_denominator);
      std::__cxx11::string::~string((string *)&error_message_7);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator);
      iVar7 = 1;
      bVar4 = false;
    }
    std::ifstream::~ifstream(&error_message);
    goto LAB_001042d3;
  }
  lVar14 = (long)num_numerator_order;
  lVar13 = (long)num_denominator_order;
  std::vector<double,_std::allocator<double>_>::vector
            (&numerator_coefficients,lVar14 + 1U,(allocator_type *)&error_message);
  std::vector<double,_std::allocator<double>_>::vector
            (&denominator_coefficients,lVar13 + 1U,(allocator_type *)&error_message);
  if ((((uVar2 & 1) == 0) || (((ulong)local_778 & 1) == 0)) ||
     (local_768 != (ifstream *)0x0 && local_730 != (char *)0x0)) {
    if (ya_optind < argc) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,"Too many input files");
      std::__cxx11::string::string
                ((string *)&ifs_for_denominator,"phase",(allocator *)&error_message_7);
      sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
      goto LAB_00103a37;
    }
    local_758 = &error_message;
    std::ifstream::ifstream(local_758);
    if ((local_730 != (char *)0x0 & bVar11) == 1) {
      std::ifstream::open((char *)&error_message,(_Ios_Openmode)local_730);
      if ((abStack_2b8[*(long *)(_error_message + -0x18)] & 5) == 0) goto LAB_00103bb8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs_for_denominator);
      poVar9 = std::operator<<((ostream *)&ifs_for_denominator,"Cannot open file ");
      std::operator<<(poVar9,local_730);
      std::__cxx11::string::string((string *)&error_message_7,"phase",(allocator *)&buffer);
      sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs_for_denominator);
      std::__cxx11::string::~string((string *)&error_message_7);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs_for_denominator);
      iVar7 = 1;
      bVar4 = false;
    }
    else {
      *numerator_coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 1.0;
LAB_00103bb8:
      piVar1 = local_768;
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 == '\0') {
        local_758 = (ostringstream *)&std::cin;
      }
      local_768 = &ifs_for_denominator;
      std::ifstream::ifstream(local_768);
      if ((piVar1 != (ifstream *)0x0 & (byte)local_778) == 1) {
        std::ifstream::open((char *)&ifs_for_denominator,(_Ios_Openmode)piVar1);
        if ((abStack_638[*(long *)(_ifs_for_denominator + -0x18)] & 5) == 0) goto LAB_00103cc8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        poVar9 = std::operator<<((ostream *)&error_message_7,"Cannot open file ");
        std::operator<<(poVar9,(char *)piVar1);
        std::__cxx11::string::string
                  ((string *)&buffer,"phase",(allocator *)&filter_coefficients_to_phase_spectrum);
        sptk::PrintErrorMessage((string *)&buffer,&error_message_7);
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
        iVar7 = 1;
        bVar4 = false;
      }
      else {
        *denominator_coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 1.0;
LAB_00103cc8:
        cVar5 = std::__basic_file<char>::is_open();
        if (cVar5 == '\0') {
          local_768 = (ifstream *)&std::cin;
        }
        sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
                  (&filter_coefficients_to_phase_spectrum,num_numerator_order,num_denominator_order,
                   fft_length,(bool)(bVar3 & 1));
        buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_00111c10;
        buffer.buffer_for_fast_fourier_transform_._vptr_Buffer = (_func_int **)&PTR__Buffer_00111c40
        ;
        memset(&buffer.buffer_for_fast_fourier_transform_.real_part_input_,0,0x90);
        if (filter_coefficients_to_phase_spectrum.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
          std::operator<<((ostream *)&error_message_7,
                          "Failed to initialize FilterCoefficientsToPhaseSpectrum");
          std::__cxx11::string::string((string *)&waveform,"phase",(allocator *)&output);
          sptk::PrintErrorMessage((string *)&waveform,&error_message_7);
          std::__cxx11::string::~string((string *)&waveform);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
          iVar7 = 1;
          bVar4 = false;
        }
        else {
          iVar7 = fft_length / 2 + 1;
          std::vector<double,_std::allocator<double>_>::vector
                    (&output,(long)iVar7,(allocator_type *)&error_message_7);
          do {
            if ((((local_760 & 1) != 0) &&
                (bVar4 = sptk::ReadStream<double>
                                   (false,0,0,(int)(lVar14 + 1U),&numerator_coefficients,
                                    (istream *)local_758,(int *)0x0), !bVar4)) ||
               ((((ulong)local_778 & 1) != 0 &&
                (bVar4 = sptk::ReadStream<double>
                                   (false,0,0,(int)(lVar13 + 1U),&denominator_coefficients,
                                    (istream *)local_768,(int *)0x0), !bVar4)))) {
              iVar7 = 0;
              bVar4 = true;
              goto LAB_0010427e;
            }
            bVar4 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                              (&filter_coefficients_to_phase_spectrum,&numerator_coefficients,
                               &denominator_coefficients,&output,&buffer);
            if (!bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
              std::operator<<((ostream *)&error_message_7,
                              "Failed to transform filter coefficients to phase");
              std::__cxx11::string::string((string *)&waveform,"phase",&local_77d);
              sptk::PrintErrorMessage((string *)&waveform,&error_message_7);
              goto LAB_00104262;
            }
            bVar4 = sptk::WriteStream<double>(0,iVar7,&output,(ostream *)&std::cout,(int *)0x0);
          } while (bVar4);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
          std::operator<<((ostream *)&error_message_7,"Failed to write phase");
          std::__cxx11::string::string((string *)&waveform,"phase",&local_77d);
          sptk::PrintErrorMessage((string *)&waveform,&error_message_7);
LAB_00104262:
          std::__cxx11::string::~string((string *)&waveform);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
          iVar7 = 1;
          bVar4 = false;
LAB_0010427e:
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&output.super__Vector_base<double,_std::allocator<double>_>);
        }
        sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer(&buffer);
        sptk::FilterCoefficientsToPhaseSpectrum::~FilterCoefficientsToPhaseSpectrum
                  (&filter_coefficients_to_phase_spectrum);
      }
      std::ifstream::~ifstream(&ifs_for_denominator);
    }
    std::ifstream::~ifstream(&error_message);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,
                    "Numerator and denominator coefficient files are required");
    std::__cxx11::string::string
              ((string *)&ifs_for_denominator,"phase",(allocator *)&error_message_7);
    sptk::PrintErrorMessage((string *)&ifs_for_denominator,&error_message);
LAB_00103a37:
    std::__cxx11::string::~string((string *)&ifs_for_denominator);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    iVar7 = 1;
    bVar4 = false;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&denominator_coefficients.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&numerator_coefficients.super__Vector_base<double,_std::allocator<double>_>);
LAB_001042d3:
  if (bVar4) {
LAB_001037fe:
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_numerator_order(kDefaultNumNumeratorOrder);
  int num_denominator_order(kDefaultNumDenominatorOrder);
  const char* numerator_coefficients_file(NULL);
  const char* denominator_coefficients_file(NULL);
  bool is_numerator_specified(false);
  bool is_denominator_specified(false);
  bool unwrapping(kDefaultUnwrappingFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:n:z:p:uh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_numerator_order) ||
            num_numerator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_numerator_specified = true;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_denominator_order) ||
            num_denominator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -n option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_denominator_specified = true;
        break;
      }
      case 'z': {
        numerator_coefficients_file = optarg;
        is_numerator_specified = true;
        break;
      }
      case 'p': {
        denominator_coefficients_file = optarg;
        is_denominator_specified = true;
        break;
      }
      case 'u': {
        unwrapping = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("phase", error_message);
    return 1;
  }

  if (is_numerator_specified || is_denominator_specified) {
    const int numerator_length(num_numerator_order + 1);
    const int denominator_length(num_denominator_order + 1);
    std::vector<double> numerator_coefficients(numerator_length);
    std::vector<double> denominator_coefficients(denominator_length);

    if (is_numerator_specified && is_denominator_specified &&
        (NULL == numerator_coefficients_file ||
         NULL == denominator_coefficients_file)) {
      std::ostringstream error_message;
      error_message
          << "Numerator and denominator coefficient files are required";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int num_input_files(argc - optind);
    if (0 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    std::ifstream ifs_for_numerator;
    if (is_numerator_specified && NULL != numerator_coefficients_file) {
      ifs_for_numerator.open(numerator_coefficients_file,
                             std::ios::in | std::ios::binary);
      if (ifs_for_numerator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << numerator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      numerator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_numerator(
        ifs_for_numerator.is_open() ? ifs_for_numerator : std::cin);

    std::ifstream ifs_for_denominator;
    if (is_denominator_specified && NULL != denominator_coefficients_file) {
      ifs_for_denominator.open(denominator_coefficients_file,
                               std::ios::in | std::ios::binary);
      if (ifs_for_denominator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << denominator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      denominator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_denominator(
        ifs_for_denominator.is_open() ? ifs_for_denominator : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum
        filter_coefficients_to_phase_spectrum(
            num_numerator_order, num_denominator_order, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!filter_coefficients_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> output(output_length);
    while ((!is_numerator_specified ||
            sptk::ReadStream(false, 0, 0, numerator_length,
                             &numerator_coefficients,
                             &input_stream_for_numerator, NULL)) &&
           (!is_denominator_specified ||
            sptk::ReadStream(false, 0, 0, denominator_length,
                             &denominator_coefficients,
                             &input_stream_for_denominator, NULL))) {
      if (!filter_coefficients_to_phase_spectrum.Run(numerator_coefficients,
                                                     denominator_coefficients,
                                                     &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform filter coefficients to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  } else {
    const int num_input_files(argc - optind);
    if (1 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }
    const char* input_file(0 == num_input_files ? NULL : argv[optind]);

    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum waveform_to_phase_spectrum(
        fft_length - 1, 0, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!waveform_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> waveform(fft_length);
    std::vector<double> output(output_length);
    while (sptk::ReadStream(true, 0, 0, fft_length, &waveform, &input_stream,
                            NULL)) {
      if (!waveform_to_phase_spectrum.Run(waveform, {1}, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  }

  return 0;
}